

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O2

void __thiscall CommandLine::~CommandLine(CommandLine *this)

{
  std::__cxx11::string::~string((string *)&this->outputFile);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

CommandLine (void)
	{
	}